

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  StatsAccumulator *in_stack_ffffffffffffffe8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  
  operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

pstd::vector<Shape> Shape::Create(
    const std::string &name, const Transform *renderFromObject,
    const Transform *objectFromRender, bool reverseOrientation,
    const ParameterDictionary &parameters,
    const std::map<std::string, FloatTexture> &floatTextures, const FileLoc *loc,
    Allocator alloc) {
    pstd::vector<Shape> shapes(alloc);
    if (name == "sphere") {
        shapes = {Sphere::Create(renderFromObject, objectFromRender, reverseOrientation,
                                 parameters, loc, alloc)};
        ++nSpheres;
    }
    // Create remaining single _Shape_ types
    else if (name == "cylinder") {
        shapes = {Cylinder::Create(renderFromObject, objectFromRender, reverseOrientation,
                                   parameters, loc, alloc)};
        ++nCylinders;
    } else if (name == "disk") {
        shapes = {Disk::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc)};
        ++nDisks;
    } else if (name == "bilinearmesh") {
        BilinearPatchMesh *mesh = BilinearPatch::CreateMesh(
            renderFromObject, reverseOrientation, parameters, loc, alloc);
        shapes = BilinearPatch::CreatePatches(mesh, alloc);
    }
    // Create multiple-_Shape_ types
    else if (name == "curve")
        shapes = Curve::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc);
    else if (name == "trianglemesh") {
        TriangleMesh *mesh = Triangle::CreateMesh(renderFromObject, reverseOrientation,
                                                  parameters, loc, alloc);
        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else if (name == "plymesh") {
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        TriQuadMesh plyMesh = TriQuadMesh::ReadPLY(filename);

        Float edgeLength = parameters.GetOneFloat("edgelength", 1.f);
        edgeLength *= Options->displacementEdgeScale;

        std::string displacementTexName = parameters.GetTexture("displacement");
        if (!displacementTexName.empty()) {
            auto iter = floatTextures.find(displacementTexName);
            if (iter == floatTextures.end())
                ErrorExit(loc, "%s: no such texture defined.", displacementTexName);
            FloatTexture displacement = iter->second;

            LOG_VERBOSE("Starting to displace mesh \"%s\" with \"%s\"", filename,
                        displacementTexName);

            int origTriCount = plyMesh.triIndices.size() / 3;
            plyMesh = plyMesh.Displace(
                [&](Point3f v0, Point3f v1) {
                    v0 = (*renderFromObject)(v0);
                    v1 = (*renderFromObject)(v1);
                    return Distance(v0, v1);
                },
                edgeLength,
                [&](Point3f *p, const Normal3f *n, const Point2f *uv, int nVertices) {
                    ParallelFor(0, nVertices, [=](int i) {
                        TextureEvalContext ctx;
                        ctx.p = p[i];
                        ctx.uv = uv[i];
                        Float d = UniversalTextureEvaluator()(displacement, ctx);
                        p[i] += Vector3f(d * n[i]);
                    });
                },
                loc);

            LOG_VERBOSE("Finished displacing mesh \"%s\" with \"%s\" -> %d tris",
                        filename, displacementTexName, plyMesh.triIndices.size() / 3);

            displacedTrisDelta += plyMesh.triIndices.size() / 3 - origTriCount;
        }

        if (!plyMesh.triIndices.empty()) {
            TriangleMesh *mesh = alloc.new_object<TriangleMesh>(
                *renderFromObject, reverseOrientation, plyMesh.triIndices, plyMesh.p,
                std::vector<Vector3f>(), plyMesh.n, plyMesh.uv, plyMesh.faceIndices,
                alloc);
            shapes = Triangle::CreateTriangles(mesh, alloc);
        }

        if (!plyMesh.quadIndices.empty()) {
            BilinearPatchMesh *mesh = alloc.new_object<BilinearPatchMesh>(
                *renderFromObject, reverseOrientation, plyMesh.quadIndices, plyMesh.p,
                plyMesh.n, plyMesh.uv, plyMesh.faceIndices, nullptr /* image dist */,
                alloc);
            pstd::vector<Shape> quadMesh = BilinearPatch::CreatePatches(mesh, alloc);
            shapes.insert(shapes.end(), quadMesh.begin(), quadMesh.end());
        }
    } else if (name == "loopsubdiv") {
        int nLevels = parameters.GetOneInt("levels", 3);
        std::vector<int> vertexIndices = parameters.GetIntArray("indices");
        if (vertexIndices.empty())
            ErrorExit(loc, "Vertex indices \"indices\" not provided for "
                           "LoopSubdiv shape.");

        std::vector<Point3f> P = parameters.GetPoint3fArray("P");
        if (P.empty())
            ErrorExit(loc, "Vertex positions \"P\" not provided for LoopSubdiv shape.");

        // don't actually use this for now...
        std::string scheme = parameters.GetOneString("scheme", "loop");

        TriangleMesh *mesh = LoopSubdivide(renderFromObject, reverseOrientation, nLevels,
                                           vertexIndices, P, alloc);

        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else
        ErrorExit(loc, "%s: shape type unknown.", name);

    if (shapes.empty())
        ErrorExit(loc, "%s: unable to create shape.", name);

    return shapes;
}